

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.hpp
# Opt level: O2

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> __thiscall
supermap::io::
DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>::
deserialize(DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>
            *this,istream *is)

{
  Key<2UL> KVar1;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> in_RAX;
  ByteArray<4UL> extraout_RDX;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar2;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_28;
  
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       in_RAX.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar1 = ShallowDeserializer<supermap::Key<2UL>,_void>::deserialize(is);
  DeserializeHelper<supermap::ByteArray<4UL>,_void>::deserialize
            ((DeserializeHelper<supermap::ByteArray<4UL>,_void> *)&local_28,is);
  *(array<unsigned_char,_2UL> *)this = KVar1.super_array<unsigned_char,_2UL>._M_elems;
  *(tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)(this + 8) =
       local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_28);
  KVar2.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       extraout_RDX.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar2._0_8_ = this;
  return KVar2;
}

Assistant:

static KeyValue<Key, Value> deserialize(std::istream &is) {
        return KeyValue<Key, Value>
            {
                io::deserialize<Key>(is),
                io::deserialize<Value>(is)
            };
    }